

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

WildcardPortConnectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::WildcardPortConnectionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2)

{
  Info *pIVar1;
  Info *pIVar2;
  size_t sVar3;
  pointer ppAVar4;
  SyntaxNode *pSVar5;
  undefined4 uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  WildcardPortConnectionSyntax *pWVar15;
  long lVar16;
  
  pWVar15 = (WildcardPortConnectionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((WildcardPortConnectionSyntax *)this->endPtr < pWVar15 + 1) {
    pWVar15 = (WildcardPortConnectionSyntax *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(pWVar15 + 1);
  }
  TVar7 = args_1->kind;
  uVar8 = args_1->field_0x2;
  NVar9.raw = (args_1->numFlags).raw;
  uVar10 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar11 = args_2->kind;
  uVar12 = args_2->field_0x2;
  NVar13.raw = (args_2->numFlags).raw;
  uVar14 = args_2->rawLen;
  pIVar2 = args_2->info;
  (pWVar15->super_PortConnectionSyntax).super_SyntaxNode.kind = WildcardPortConnection;
  (pWVar15->super_PortConnectionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pWVar15->super_PortConnectionSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar6 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar5 = (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pWVar15->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(pWVar15->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
       = uVar6;
  (pWVar15->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       pSVar5;
  (pWVar15->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode
       = (args->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pWVar15->super_PortConnectionSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f7698;
  (pWVar15->super_PortConnectionSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar3 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pWVar15->super_PortConnectionSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)._M_ptr;
  (pWVar15->super_PortConnectionSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar3;
  (pWVar15->super_PortConnectionSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002f75e8;
  (pWVar15->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pWVar15;
  sVar3 = (pWVar15->super_PortConnectionSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar3 != 0) {
    ppAVar4 = (pWVar15->super_PortConnectionSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar16 = 0;
    do {
      *(WildcardPortConnectionSyntax **)(*(long *)((long)ppAVar4 + lVar16) + 8) = pWVar15;
      lVar16 = lVar16 + 8;
    } while (sVar3 << 3 != lVar16);
  }
  (pWVar15->dot).kind = TVar7;
  (pWVar15->dot).field_0x2 = uVar8;
  (pWVar15->dot).numFlags = (NumericTokenFlags)NVar9.raw;
  (pWVar15->dot).rawLen = uVar10;
  (pWVar15->dot).info = pIVar1;
  (pWVar15->star).kind = TVar11;
  (pWVar15->star).field_0x2 = uVar12;
  (pWVar15->star).numFlags = (NumericTokenFlags)NVar13.raw;
  (pWVar15->star).rawLen = uVar14;
  (pWVar15->star).info = pIVar2;
  return pWVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }